

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O2

void av1_fwd_txfm2d_32x64_c(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  byte bVar6;
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [2048];
  TXFM_2D_FLIP_CFG TStack_20a0;
  int32_t local_2060 [2060];
  
  bVar6 = 0;
  av1_get_fwd_txfm_cfg(tx_type,'\v',&TStack_20a0);
  fwd_txfm2d_c(input,output,stride,&TStack_20a0,local_2060,bd);
  for (lVar2 = 0; lVar2 != 0x2000; lVar2 = lVar2 + 0x100) {
    puVar1 = (undefined8 *)((long)output + lVar2 + 0xf0);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)output + lVar2 + 0xe0);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)output + lVar2 + 0xd0);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)output + lVar2 + 0xc0);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)output + lVar2 + 0xb0);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)output + lVar2 + 0xa0);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)output + lVar2 + 0x90);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)output + lVar2 + 0x80);
    *puVar1 = 0;
    puVar1[1] = 0;
  }
  for (lVar2 = 0x80; lVar2 != 0x1000; lVar2 = lVar2 + 0x80) {
    puVar4 = (undefined4 *)((long)output + lVar2 * 2);
    puVar5 = (undefined4 *)((long)output + lVar2);
    for (lVar3 = 0x20; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_32x64_c(const int16_t *input, int32_t *output, int stride,
                            TX_TYPE tx_type, int bd) {
  DECLARE_ALIGNED(32, int32_t, txfm_buf[32 * 64]);
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_32X64, &cfg);
  fwd_txfm2d_c(input, output, stride, &cfg, txfm_buf, bd);
  // Zero out right 32x32 area.
  for (int col = 0; col < 32; ++col) {
    memset(output + col * 64 + 32, 0, 32 * sizeof(*output));
  }
  // Re-pack non-zero coeffs in the first 32x32 indices.
  for (int col = 1; col < 32; ++col) {
    memcpy(output + col * 32, output + col * 64, 32 * sizeof(*output));
  }
}